

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_AutoArgIndex_Test::TestBody(FormatterTest_AutoArgIndex_Test *this)

{
  bool bVar1;
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_6;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_5;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_2;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  char (*in_stack_fffffffffffffb18) [4];
  char *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  char *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  Type in_stack_fffffffffffffb3c;
  AssertionResult *in_stack_fffffffffffffb40;
  AssertionResult *this_00;
  int *in_stack_fffffffffffffb58;
  double *in_stack_fffffffffffffb60;
  char (*in_stack_fffffffffffffb68) [8];
  char *in_stack_fffffffffffffb70;
  char (*in_stack_fffffffffffffb78) [7];
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  allocator *in_stack_fffffffffffffb90;
  string local_318 [38];
  byte local_2f2;
  undefined1 local_2f1 [33];
  AssertionResult local_2d0 [3];
  undefined4 local_29c;
  undefined8 local_298;
  string local_290 [38];
  byte local_26a;
  allocator local_269;
  string local_268 [32];
  AssertionResult local_248 [3];
  undefined4 local_214;
  undefined8 local_210;
  string local_208 [38];
  byte local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  AssertionResult local_1c0 [2];
  undefined4 local_19c;
  undefined8 local_198;
  string local_190 [32];
  AssertionResult local_170 [3];
  undefined1 local_13a;
  undefined1 local_139;
  string local_138 [38];
  byte local_112;
  allocator local_111;
  string local_110 [32];
  AssertionResult local_f0 [3];
  int local_c0;
  undefined1 local_ba;
  undefined1 local_b9;
  string local_b8 [38];
  byte local_92;
  allocator local_91;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  string local_38 [32];
  AssertionResult local_18;
  
  local_39 = 0x61;
  local_3a = 0x62;
  local_3b = 99;
  fmt::v5::format<char[7],char,char,char>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,*in_stack_fffffffffffffb68,
             (char *)in_stack_fffffffffffffb60);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x134827);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x13488a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1348e2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,"cannot switch from manual to automatic argument indexing",&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_92 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b9 = 0x61;
      local_ba = 0x62;
      fmt::v5::format<char[6],char,char>
                ((char (*) [6])in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 (char *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string(local_b8);
    }
    if ((local_92 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb40,
                 (char (*) [107])CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_c0 = 2;
    }
    else {
      local_c0 = 0;
    }
    std::__cxx11::string::~string(local_90);
    if (local_c0 != 0) goto LAB_00134c95;
  }
  else {
LAB_00134c95:
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x134cb1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x134d14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134d6c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_110,"cannot switch from automatic to manual argument indexing",&local_111);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    local_112 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_139 = 0x61;
      local_13a = 0x62;
      fmt::v5::format<char[6],char,char>
                ((char (*) [6])in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 (char *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string(local_138);
    }
    if ((local_112 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb40,
                 (char (*) [107])CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_c0 = 3;
    }
    else {
      local_c0 = 0;
    }
    std::__cxx11::string::~string(local_110);
    if (local_c0 != 0) goto LAB_0013511f;
  }
  else {
LAB_0013511f:
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x13513b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x13519e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1351f6);
  local_198 = 0x3ff3c083126e978d;
  local_19c = 2;
  fmt::v5::format<char[7],double,int>
            ((char (*) [7])in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x13530d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x135370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1353c8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1e0,"cannot switch from manual to automatic argument indexing",&local_1e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    local_1e2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_210 = 0x3ff3c083126e978d;
      local_214 = 2;
      fmt::v5::format<char[8],double,int>
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::__cxx11::string::~string(local_208);
    }
    if ((local_1e2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb40,
                 (char (*) [110])CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_c0 = 4;
    }
    else {
      local_c0 = 0;
    }
    std::__cxx11::string::~string(local_1e0);
    if (local_c0 != 0) goto LAB_00135788;
  }
  else {
LAB_00135788:
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x1357a4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x135807);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13585f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (bVar1) {
    in_stack_fffffffffffffb90 = &local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_268,"cannot switch from automatic to manual argument indexing",
               in_stack_fffffffffffffb90);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    local_26a = 0;
    in_stack_fffffffffffffb8f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffb8f) {
      local_298 = 0x3ff3c083126e978d;
      local_29c = 2;
      fmt::v5::format<char[8],double,int>
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::__cxx11::string::~string(local_290);
    }
    if ((local_26a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb40,
                 (char (*) [110])CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_c0 = 5;
    }
    else {
      local_c0 = 0;
    }
    std::__cxx11::string::~string(local_268);
    if (local_c0 != 0) goto LAB_00135c01;
  }
  else {
LAB_00135c01:
    testing::Message::Message((Message *)in_stack_fffffffffffffb40);
    testing::AssertionResult::failure_message((AssertionResult *)0x135c1d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb90,
               (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
    testing::Message::~Message((Message *)0x135c7a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135cd2);
  this_00 = local_2d0;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffffb40 = (AssertionResult *)local_2f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_2f1 + 1),"argument index out of range",
               (allocator *)in_stack_fffffffffffffb40);
    std::allocator<char>::~allocator((allocator<char> *)local_2f1);
    local_2f2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffb3c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb3c);
    if (bVar1) {
      fmt::v5::format<char[3]>(&this_00->success_);
      std::__cxx11::string::~string(local_318);
    }
    if ((local_2f2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffb40,
                 (char (*) [94])CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_c0 = 6;
    }
    else {
      local_c0 = 0;
    }
    std::__cxx11::string::~string((string *)(local_2f1 + 1));
    if (local_c0 == 0) goto LAB_001360e8;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffb40);
  testing::AssertionResult::failure_message((AssertionResult *)0x136045);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffb90,
             (Message *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
  testing::Message::~Message((Message *)0x1360a0);
LAB_001360e8:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1360f5);
  return;
}

Assistant:

TEST(FormatterTest, AutoArgIndex) {
  EXPECT_EQ("abc", format("{}{}{}", 'a', 'b', 'c'));
  EXPECT_THROW_MSG(format("{0}{}", 'a', 'b'),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{}{0}", 'a', 'b'),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_EQ("1.2", format("{:.{}}", 1.2345, 2));
  EXPECT_THROW_MSG(format("{0}:.{}", 1.2345, 2),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{:.{0}}", 1.2345, 2),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_THROW_MSG(format("{}"), format_error, "argument index out of range");
}